

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O2

void stcatprintf_s(tchar_t *Out,size_t OutLen,tchar_t *Mask,...)

{
  char in_AL;
  size_t sVar1;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list Arg;
  __va_list_tag local_e8;
  undefined1 local_c8 [24];
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  
  if (in_AL != '\0') {
    local_98 = in_XMM0_Qa;
    local_88 = in_XMM1_Qa;
    local_78 = in_XMM2_Qa;
    local_68 = in_XMM3_Qa;
    local_58 = in_XMM4_Qa;
    local_48 = in_XMM5_Qa;
    local_38 = in_XMM6_Qa;
    local_28 = in_XMM7_Qa;
  }
  local_b0 = in_RCX;
  local_a8 = in_R8;
  local_a0 = in_R9;
  sVar1 = strlen(Out);
  if (sVar1 <= OutLen && OutLen - sVar1 != 0) {
    local_e8.reg_save_area = local_c8;
    local_e8.overflow_arg_area = &Arg[0].overflow_arg_area;
    local_e8.gp_offset = 0x18;
    local_e8.fp_offset = 0x30;
    vstprintf_s(Out + sVar1,OutLen - sVar1,Mask,&local_e8);
  }
  return;
}

Assistant:

void stcatprintf_s(tchar_t* Out,size_t OutLen,const tchar_t* Mask, ...)
{
    size_t n = tcslen(Out);
    if (OutLen>n)
    {
	    va_list Arg;
	    va_start(Arg, Mask);
	    vstprintf_s(Out+n,OutLen-n,Mask,Arg);
	    va_end(Arg);
    }
}